

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O2

int lj_sysprof_set_backtracer(luam_Sysprof_backtracer backtracer)

{
  int iVar1;
  void *in_RAX;
  sysprof *psVar2;
  void *dummy;
  
  if (sysprof.state != 0) {
    return 1;
  }
  psVar2 = (sysprof *)&dummy;
  sysprof.backtracer = backtracer;
  dummy = in_RAX;
  if (backtracer == (luam_Sysprof_backtracer)0x0) {
    sysprof.backtracer = default_backtrace_host;
    dummy = (void *)0x0;
    backtrace(&dummy,1);
    backtracer = (luam_Sysprof_backtracer)psVar2;
  }
  iVar1 = is_unconfigured((sysprof *)backtracer);
  if (iVar1 == 0) {
    sysprof.state = 0;
    return 0;
  }
  return 0;
}

Assistant:

int lj_sysprof_set_backtracer(luam_Sysprof_backtracer backtracer) {
  struct sysprof *sp = &sysprof;

  if (sp->state != SPS_IDLE)
    return PROFILE_ERRUSE;
  if (backtracer == NULL) {
    sp->backtracer = default_backtrace_host;
    /*
    ** XXX: `backtrace` is not signal-safe, according to man,
    ** because it is lazy loaded on the first call, which triggers
    ** allocations. We need to call `backtrace` before starting profiling
    ** to avoid lazy loading.
    */
    void *dummy = NULL;
    backtrace(&dummy, 1);
  }
  else {
    sp->backtracer = backtracer;
  }
  if (!is_unconfigured(sp)) {
    sp->state = SPS_IDLE;
  }
  return PROFILE_SUCCESS;
}